

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O3

void __thiscall Fl_Tree::show_item_bottom(Fl_Tree *this,Fl_Tree_Item *item)

{
  if ((item == (Fl_Tree_Item *)0x0) && (item = this->_root, item == (Fl_Tree_Item *)0x0)) {
    return;
  }
  show_item(this,item,(this->super_Fl_Group).super_Fl_Widget.h_ - item->_xywh[3]);
  return;
}

Assistant:

void Fl_Tree::show_item_bottom(Fl_Tree_Item *item) {
  item = item ? item : first();
#if FLTK_ABI_VERSION >= 10303
  if (item) show_item(item, _tih-item->h());
#else
  if (item) show_item(item, h()-item->h());
#endif
}